

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O2

void __thiscall
sf::priv::GlxContext::createSurface
          (GlxContext *this,GlxContext *shared,uint width,uint height,uint bitsPerPixel)

{
  Display *pDVar1;
  GLXFBConfig *pp_Var2;
  XVisualInfo *pXVar3;
  Window WVar4;
  GLXPbuffer GVar5;
  long lVar6;
  long lVar7;
  int nbConfigs;
  int minor;
  int major;
  XVisualInfo visualInfo;
  XSetWindowAttributes attributes;
  
  selectBestVisual(&visualInfo,this->m_display,bitsPerPixel,&(this->super_GlContext).m_settings);
  if ((shared != (GlxContext *)0x0) && (SF_GLAD_GLX_SGIX_pbuffer != 0)) {
    major = 0;
    minor = 0;
    (*sf_glad_glXQueryVersion)(this->m_display,&major,&minor);
    if ((1 < major) || (2 < minor)) {
      nbConfigs = 0;
      pp_Var2 = (*sf_glad_glXChooseFBConfig)
                          (this->m_display,*(int *)(this->m_display + 0xe0),(int *)0x0,&nbConfigs);
      if (pp_Var2 != (GLXFBConfig *)0x0) {
        for (lVar6 = 0; lVar6 < nbConfigs; lVar6 = lVar6 + 1) {
          pXVar3 = (*sf_glad_glXGetVisualFromFBConfig)(this->m_display,pp_Var2[lVar6]);
          if (pXVar3 != (XVisualInfo *)0x0) {
            if (pXVar3->visualid == visualInfo.visualid) {
              XFree(pXVar3);
              attributes.background_pixmap._0_4_ = 0x8041;
              attributes.background_pixel._0_4_ = 0x8040;
              attributes.border_pixmap = 0;
              attributes.background_pixmap._4_4_ = width;
              attributes.background_pixel._4_4_ = height;
              GVar5 = (*sf_glad_glXCreatePbuffer)(this->m_display,pp_Var2[lVar6],(int *)&attributes)
              ;
              this->m_pbuffer = GVar5;
              updateSettingsFromVisualInfo(this,&visualInfo);
              XFree(pp_Var2);
              return;
            }
            XFree(pXVar3);
          }
        }
        XFree(pp_Var2);
      }
    }
  }
  pDVar1 = this->m_display;
  lVar7 = (long)*(int *)(pDVar1 + 0xe0) * 0x80;
  attributes.colormap =
       XCreateColormap(pDVar1,*(undefined8 *)(*(long *)(pDVar1 + 0xe8) + 0x10 + lVar7),
                       visualInfo.visual,0);
  lVar6 = *(long *)(this->m_display + 0xe8);
  WVar4 = XCreateWindow(this->m_display,*(undefined8 *)(lVar6 + 0x10 + lVar7),0,0,width,height,0,
                        *(undefined4 *)(lVar6 + 0x38 + lVar7),1,visualInfo.visual,0x2000,&attributes
                       );
  this->m_window = WVar4;
  this->m_ownsWindow = true;
  updateSettingsFromWindow(this);
  return;
}

Assistant:

void GlxContext::createSurface(GlxContext* shared, unsigned int width, unsigned int height, unsigned int bitsPerPixel)
{
    // Choose the visual according to the context settings
    XVisualInfo visualInfo = selectBestVisual(m_display, bitsPerPixel, m_settings);

    // Check if the shared context already exists and pbuffers are supported
    if (shared && SF_GLAD_GLX_SGIX_pbuffer)
    {
        // There are no GLX versions prior to 1.0
        int major = 0;
        int minor = 0;

        glXQueryVersion(m_display, &major, &minor);

        // Check if glXCreatePbuffer is available (requires GLX 1.3 or greater)
        bool hasCreatePbuffer = ((major > 1) || (minor >= 3));

        if (hasCreatePbuffer)
        {
            // Get a GLXFBConfig that matches the visual
            GLXFBConfig* config = NULL;

            // We don't supply attributes to match against, since
            // the visual we are matching against was already
            // deemed suitable in selectBestVisual()
            int nbConfigs = 0;
            GLXFBConfig* configs = glXChooseFBConfig(m_display, DefaultScreen(m_display), NULL, &nbConfigs);

            for (int i = 0; configs && (i < nbConfigs); ++i)
            {
                XVisualInfo* visual = glXGetVisualFromFBConfig(m_display, configs[i]);

                if (!visual)
                    continue;

                if (visual->visualid == visualInfo.visualid)
                {
                    config = &configs[i];
                    XFree(visual);
                    break;
                }

                XFree(visual);
            }

            if (config)
            {
                int attributes[] =
                {
                    GLX_PBUFFER_WIDTH,  static_cast<int>(width),
                    GLX_PBUFFER_HEIGHT, static_cast<int>(height),
                    0,                  0
                };

                m_pbuffer = glXCreatePbuffer(m_display, *config, attributes);

                updateSettingsFromVisualInfo(&visualInfo);

                XFree(configs);

                return;
            }

            if (configs)
                XFree(configs);
        }
    }

    // If pbuffers are not available we use a hidden window as the off-screen surface to draw to
    int screen = DefaultScreen(m_display);

    // Define the window attributes
    XSetWindowAttributes attributes;
    attributes.colormap = XCreateColormap(m_display, RootWindow(m_display, screen), visualInfo.visual, AllocNone);

    // Note: bitsPerPixel is explicitly ignored. Instead, DefaultDepth() is used in order to avoid window creation failure due to
    // a depth not supported by the X window system. On Unix/Linux, the window's pixel format is not directly associated with the
    // rendering surface (unlike on Windows, for example).
    m_window = XCreateWindow(m_display,
                             RootWindow(m_display, screen),
                             0, 0,
                             width, height,
                             0,
                             DefaultDepth(m_display, screen),
                             InputOutput,
                             visualInfo.visual,
                             CWColormap,
                             &attributes);

    m_ownsWindow = true;

    updateSettingsFromWindow();
}